

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

bool nullcInitIOModule(void *context,_func_uint_void_ptr_char_ptr_uint *writeFunc,
                      _func_uint_void_ptr_char_ptr_uint *readFunc)

{
  nullres nVar1;
  
  NULLCIO::contextFunc = context;
  NULLCIO::writeFunc = writeFunc;
  NULLCIO::readFunc = readFunc;
  nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray>("std.io",NULLCIO::WriteToConsole,"Print",0)
  ;
  if (nVar1 == '\0') {
    return false;
  }
  nVar1 = nullcBindModuleFunctionHelper<void,int,int>("std.io",NULLCIO::WriteIntConsole,"Print",1);
  if ((((nVar1 != '\0') &&
       (nVar1 = nullcBindModuleFunctionHelper<void,double,int>
                          ("std.io",NULLCIO::WriteDoubleConsole,"Print",2), nVar1 != '\0')) &&
      (nVar1 = nullcBindModuleFunctionHelper<void,long_long,int>
                         ("std.io",NULLCIO::WriteLongConsole,"Print",3), nVar1 != '\0')) &&
     (nVar1 = nullcBindModuleFunctionHelper<void,char>("std.io",NULLCIO::WriteCharConsole,"Print",4)
     , nVar1 != '\0')) {
    nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray>
                      ("std.io",NULLCIO::ReadTextFromConsole,"Input",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<void,int*>("std.io",NULLCIO::ReadIntFromConsole,"Input",1)
    ;
    if (nVar1 != '\0') {
      nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray>
                        ("std.io",NULLCIO::WriteToConsoleExact,"Write",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<void,int,int>
                        ("std.io",NULLCIO::SetConsoleCursorPos,"SetConsoleCursorPos",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray>
                        ("std.io",NULLCIO::GetKeyboardState,"GetKeyboardState",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<void,int*,int*>
                        ("std.io",NULLCIO::GetMouseState,"GetMouseState",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<bool,int>("std.io",NULLCIO::IsPressed,"IsPressed",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<bool,int>("std.io",NULLCIO::IsToggled,"IsToggled",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<bool,int>("std.io",NULLCIO::IsPressed,"IsPressed",1);
      if (nVar1 != '\0') {
        nVar1 = nullcBindModuleFunctionHelper<bool,int>("std.io",NULLCIO::IsToggled,"IsToggled",1);
        return nVar1 != '\0';
      }
    }
  }
  return false;
}

Assistant:

bool nullcInitIOModule(void *context, unsigned (*writeFunc)(void *context, char *data, unsigned length), unsigned (*readFunc)(void *context, char *target, unsigned length))
{
	NULLCIO::contextFunc = context;
	NULLCIO::writeFunc = writeFunc;
	NULLCIO::readFunc = readFunc;

	REGISTER_FUNC(WriteToConsole, "Print", 0);
	REGISTER_FUNC(WriteIntConsole, "Print", 1);
	REGISTER_FUNC(WriteDoubleConsole, "Print", 2);
	REGISTER_FUNC(WriteLongConsole, "Print", 3);
	REGISTER_FUNC(WriteCharConsole, "Print", 4);
	REGISTER_FUNC(ReadTextFromConsole, "Input", 0);
	REGISTER_FUNC(ReadIntFromConsole, "Input", 1);
	REGISTER_FUNC(WriteToConsoleExact, "Write", 0);
	REGISTER_FUNC(SetConsoleCursorPos, "SetConsoleCursorPos", 0);

	REGISTER_FUNC(GetKeyboardState, "GetKeyboardState", 0);
	REGISTER_FUNC(GetMouseState, "GetMouseState", 0);
	REGISTER_FUNC(IsPressed, "IsPressed", 0);
	REGISTER_FUNC(IsToggled, "IsToggled", 0);
	REGISTER_FUNC(IsPressed, "IsPressed", 1);
	REGISTER_FUNC(IsToggled, "IsToggled", 1);

	return true;
}